

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_model.hpp
# Opt level: O2

int __thiscall
BaseModel::collectChessboardCorners
          (BaseModel *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *image_list,Size *board_size,Size *square_size,Size *image_size,
          vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
          *object_points_list,
          vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
          *image_points_list,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *image_list_detected,bool show_result)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  allocator local_18d;
  int local_18c;
  int base_line;
  uint local_184;
  int local_180;
  int local_17c;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> image_points;
  Size text_size;
  string msg;
  _InputArray local_108;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> object_points;
  undefined4 local_d8 [2];
  Mat *local_d0;
  undefined8 local_c8;
  Matx<double,_4,_1> local_b8;
  Mat image;
  
  createChessboardCorners(&object_points,this,board_size,square_size);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(image_list_detected);
  std::
  vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
  ::clear(object_points_list);
  std::
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  ::clear(image_points_list);
  local_184 = (uint)show_result;
  lVar8 = 0;
  uVar7 = 0;
  local_18c = 0;
  do {
    if ((ulong)((long)(image_list->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(image_list->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar7) break;
    poVar5 = std::operator<<((ostream *)&std::cout,"Load image: ");
    std::operator<<(poVar5,(string *)
                           ((long)&(((image_list->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                           + lVar8));
    cv::imread((string *)&image,
               (int)(image_list->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + (int)lVar8);
    cVar1 = cv::Mat::empty();
    if (cVar1 == '\0') {
      iVar4 = image_size->height;
      if (image_size->width == 0 && iVar4 == 0) {
        image_size->width = image.cols;
        image_size->height = image.rows;
        iVar4 = image.rows;
      }
      else if (image_size->width != image.cols) goto LAB_0010ce90;
      if (iVar4 != image.rows) {
LAB_0010ce90:
        __assert_fail("image_size.width == image.cols and image_size.height == image.rows",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sleepbysleep[P]extensive_calibrate/base_model.hpp"
                      ,0x19a,
                      "int BaseModel::collectChessboardCorners(const std::vector<std::string> &, const cv::Size &, const cv::Size &, cv::Size &, std::vector<std::vector<cv::Point3f>> &, std::vector<std::vector<cv::Point2f>> &, std::vector<std::string> &, bool)"
                     );
      }
      image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = detectChessboardCorners(this,&image,board_size,&image_points,SUB41(local_184,0));
      if (bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(image_list_detected,
                    (value_type *)
                    ((long)&(((image_list->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8
                    ));
        std::
        vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
        ::push_back(object_points_list,&object_points);
        std::
        vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
        ::push_back(image_points_list,&image_points);
        local_18c = local_18c + 1;
      }
      cv::format_abi_cxx11_
                ((char *)&msg,"%d/%d",(ulong)((int)uVar7 + 1),
                 (ulong)((long)(image_list->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(image_list->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 5);
      pcVar6 = " Detecting crosses of chessboard complete - ";
      if (!bVar2) {
        pcVar6 = " Detecting crosses of chessboard failed! - ";
      }
      poVar5 = std::operator<<((ostream *)&std::cout,pcVar6);
      poVar5 = std::operator<<(poVar5,(string *)&msg);
      std::operator<<(poVar5,"\n");
      if (show_result) {
        base_line = 0;
        cv::getTextSize((string *)&text_size,(int)&msg,1.0,1,(int *)0x1);
        local_c8 = 0;
        local_d8[0] = 0x3010000;
        local_180 = text_size.width + 10;
        local_17c = base_line * 2 + 10;
        local_d0 = &image;
        cv::Matx<double,_4,_1>::Matx(&local_b8);
        local_b8.val[0] = 0.0;
        local_b8.val[1] = 0.0;
        local_b8.val[2] = 255.0;
        local_b8.val[3] = 0.0;
        cv::putText(0,(string *)local_d8,&msg,&local_180,1,&local_b8,1,8,0);
        std::__cxx11::string::string((string *)local_d8,"Image",&local_18d);
        local_108.sz.width = 0;
        local_108.sz.height = 0;
        local_108.flags = 0x1010000;
        local_108.obj = &image;
        cv::imshow((string *)local_d8,&local_108);
        std::__cxx11::string::~string((string *)local_d8);
        bVar3 = cv::waitKey(500);
        if ((bVar3 == 0x1b) || ((bVar3 & 0xdf) == 0x51)) {
          exit(-1);
        }
      }
      std::__cxx11::string::~string((string *)&msg);
      std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
                (&image_points.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
    }
    else {
      std::operator+(&msg,"Invalid image path: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((image_list->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar8));
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&msg);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&msg);
    }
    cv::Mat::~Mat(&image);
    uVar7 = uVar7 + 1;
    lVar8 = lVar8 + 0x20;
  } while (cVar1 == '\0');
  std::_Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~_Vector_base
            (&object_points.
              super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>);
  return local_18c;
}

Assistant:

int collectChessboardCorners(
    const std::vector<std::string>& image_list,
    const cv::Size& board_size,
    const cv::Size& square_size,
    cv::Size& image_size,
    std::vector<std::vector<cv::Point3f>>& object_points_list,
    std::vector<std::vector<cv::Point2f>>& image_points_list,
    std::vector<std::string>& image_list_detected,
    bool show_result=true
  ) {
    std::vector<cv::Point3f> object_points = this->createChessboardCorners(board_size, square_size);

    int count = 0;
    image_list_detected.clear();
    object_points_list.clear();
    image_points_list.clear();
    for (size_t i = 0; i < image_list.size(); ++i) {
      if (DEBUG) std::cout << "Load image: " << image_list[i];
    
      cv::Mat image = cv::imread(image_list[i], cv::IMREAD_COLOR);
      if (image.empty()) {
	std::cerr << "Invalid image path: " + image_list[i] << std::endl;
	break;
      }

      if (image_size == cv::Size(0,0)) {
	image_size.width = image.cols;
	image_size.height = image.rows;
      }
      assert(image_size.width == image.cols and image_size.height == image.rows);
      
      std::vector<cv::Point2f> image_points;
      bool found = this->detectChessboardCorners(
	image,
	board_size,
	image_points,
	show_result
      );
      
      if (found) {
	image_list_detected.push_back(image_list[i]);
	object_points_list.push_back(object_points);
	image_points_list.push_back(image_points);
	++count;
      }

      std::string msg = cv::format("%d/%d", (int)(i+1), (int)image_list.size());
      if (DEBUG) {
	if (found) {
	  std::cout << " Detecting crosses of chessboard complete - " << msg << "\n";
	} else {
	  std::cout << " Detecting crosses of chessboard failed! - " << msg << "\n";
	}
      }

      if (show_result) {
	//cv::drawChessboardCorners(image, board_size, cv::Mat(image_points), found);

	int base_line = 0;
	cv::Size text_size = cv::getTextSize(msg, 1, 1, 1, &base_line);

	cv::putText(image, msg,
		    cv::Point(10 + text_size.width, 10 + 2 * base_line),
		    1, 1, cv::Scalar(0,0,255));
	cv::imshow("Image", image);
	char key = (char)cv::waitKey(500);
	if (key == 27 || key == 'q' || key == 'Q') {
	  exit(-1);
	}
      }
    }
    return count;
  }